

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_286a9::FileSystemTest_testRecursiveRemovalDoesNotFollowSymlinks_Test::TestBody
          (FileSystemTest_testRecursiveRemovalDoesNotFollowSymlinks_Test *this)

{
  Child CVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int *rhs;
  __mode_t _Var7;
  char *in_R9;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Str;
  StringRef Filename_00;
  StringRef Str_00;
  AssertionResult gtest_ar__2;
  int res;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  StatStruct statbuf;
  SmallString<256U> linkPath;
  SmallString<256U> directoryLinkPath;
  SmallString<256U> tempDir;
  SmallString<256U> otherFile;
  SmallString<256U> otherDir;
  SmallString<256U> file;
  TmpDir rootTempDir;
  Child local_890;
  Child local_888 [2];
  AssertHelper local_878;
  Child local_870 [3];
  int local_854;
  Child local_850;
  Child local_848 [3];
  Child local_830;
  Child local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_820 [8];
  Child local_7a0;
  Child local_798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790 [16];
  Child local_690;
  Child local_688;
  Twine local_680 [10];
  Child local_580;
  Child local_578;
  Twine local_570 [10];
  Child local_470;
  undefined4 local_468;
  undefined4 uStack_464;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460 [16];
  Child local_360;
  ulong local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [16];
  SmallString<256U> local_250;
  TmpDir local_140;
  int iVar6;
  Child *pCVar8;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&local_140,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_360,&local_140);
  local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &local_250.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_250,local_360.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_360.twine)->LHS)->_M_local_buf + local_358);
  if (local_360.twine != (Twine *)local_350) {
    operator_delete(local_360.twine,local_350[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_360,"test.txt");
  llvm::Twine::Twine((Twine *)&local_470,"");
  llvm::Twine::Twine((Twine *)&local_580,"");
  llvm::Twine::Twine((Twine *)&local_7a0,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_250,(Twine *)&local_360,(Twine *)&local_470,
             (Twine *)&local_580,(Twine *)&local_7a0);
  local_580.twine = (Twine *)((ulong)(uint)local_580._4_4_ << 0x20);
  local_850.twine = (Twine *)std::_V2::system_category();
  Filename.Length._0_4_ =
       local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  Filename.Data =
       (char *)local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX;
  Filename.Length._4_4_ = 0;
  local_578.twine = local_850.twine;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_360,Filename,(error_code *)&local_580,F_Text);
  local_7a0.character = local_580.decUI == 0;
  local_798.twine = (Twine *)0x0;
  if (local_580.decUI != 0) {
    testing::Message::Message((Message *)&local_690);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_470,(internal *)&local_7a0.character,(AssertionResult *)0x19ae70,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x6f,local_470.cString);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_830,(Message *)&local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470.twine != local_460) {
      operator_delete(local_470.twine,local_460[0]._M_allocated_capacity + 1);
    }
    if (local_690.twine != (Twine *)0x0) {
      (**(code **)(*local_690.decUL + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_798.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_798.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_798.twine);
  }
  Str.Length = 0xd;
  Str.Data = "Hello, world!";
  iVar6 = 0x19a817;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_360,Str);
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&local_360,iVar6);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_360);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_470,&local_140);
  local_358 = 0x10000000000;
  local_360.twine = (Twine *)local_350;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_360,local_470.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_470.twine)->LHS)->_M_local_buf + CONCAT44(uStack_464,local_468));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.twine != local_460) {
    operator_delete(local_470.twine,local_460[0]._M_allocated_capacity + 1);
  }
  pCVar8 = &local_470;
  llvm::Twine::Twine((Twine *)pCVar8,"other_dir");
  llvm::Twine::Twine((Twine *)&local_580,"");
  llvm::Twine::Twine((Twine *)&local_7a0,"");
  llvm::Twine::Twine((Twine *)&local_690,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_360,(Twine *)pCVar8,(Twine *)&local_580,
             (Twine *)&local_7a0,(Twine *)&local_690);
  _Var7 = (__mode_t)pCVar8;
  pcVar3 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_360);
  llbuild::basic::sys::mkdir(pcVar3,_Var7);
  local_470.twine = (Twine *)local_460;
  local_468 = 0;
  uStack_464 = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_470,local_360.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_360.twine)->LHS)->_M_local_buf + (local_358 & 0xffffffff));
  llvm::Twine::Twine((Twine *)&local_580,"test.txt");
  llvm::Twine::Twine((Twine *)&local_7a0,"");
  llvm::Twine::Twine((Twine *)&local_690,"");
  llvm::Twine::Twine((Twine *)&local_830,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_470,(Twine *)&local_580,(Twine *)&local_7a0,
             (Twine *)&local_690,(Twine *)&local_830);
  local_690.twine = (Twine *)((ulong)(uint)local_690._4_4_ << 0x20);
  local_688 = local_850;
  Filename_00.Length._0_4_ = local_468;
  Filename_00.Data = local_470.cString;
  Filename_00.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_580,Filename_00,(error_code *)&local_690,F_Text);
  local_830.character = local_690.decUI == 0;
  local_828.twine = (Twine *)0x0;
  if (local_690.decUI != 0) {
    testing::Message::Message((Message *)&local_890);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_7a0,(internal *)&local_830.character,(AssertionResult *)0x19ae70,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x7d,local_7a0.cString);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_848,(Message *)&local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_848);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0.twine != local_790) {
      operator_delete(local_7a0.twine,local_790[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_890._4_4_,local_890.decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_890._4_4_,local_890.decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_828.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_828.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_828.twine);
  }
  Str_00.Length = 0xd;
  Str_00.Data = "Hello, world!";
  iVar6 = 0x19a817;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_580,Str_00);
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&local_580,iVar6);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_580);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_7a0,&local_140);
  local_580.twine = local_570;
  local_578 = (Child)0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_580,local_7a0.cString,
             (long)&(local_798.twine)->LHS + local_7a0.cString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0.twine != local_790) {
    operator_delete(local_7a0.twine,local_790[0]._M_allocated_capacity + 1);
  }
  pCVar8 = &local_7a0;
  llvm::Twine::Twine((Twine *)pCVar8,"root");
  pcVar3 = "";
  llvm::Twine::Twine((Twine *)&local_690,"");
  llvm::Twine::Twine((Twine *)&local_830,"");
  llvm::Twine::Twine((Twine *)&local_890,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_580,(Twine *)pCVar8,(Twine *)&local_690,
             (Twine *)&local_830,(Twine *)&local_890);
  _Var7 = (__mode_t)pCVar8;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_580);
  llbuild::basic::sys::mkdir(pcVar4,_Var7);
  local_7a0.twine = (Twine *)local_790;
  local_798 = (Child)0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_7a0,local_580.cString,
             (char *)((long)&(local_580.twine)->LHS + ((ulong)local_578.twine & 0xffffffff)));
  llvm::Twine::Twine((Twine *)&local_690,"link.txt");
  llvm::Twine::Twine((Twine *)&local_830,"");
  llvm::Twine::Twine((Twine *)&local_890,"");
  llvm::Twine::Twine((Twine *)local_848,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_7a0,(Twine *)&local_690,(Twine *)&local_830,
             (Twine *)&local_890,(Twine *)local_848);
  pcVar4 = llvm::SmallString<256U>::c_str(&local_250);
  pcVar5 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_7a0);
  local_854 = llbuild::basic::sys::symlink(pcVar4,pcVar5);
  local_830.decUI = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_690.character,"res","0",&local_854,&local_830.decI);
  if (local_690.character == '\0') {
    testing::Message::Message((Message *)&local_830);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688.twine !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((_Alloc_hider *)&(local_688.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_890,(Message *)&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_890);
    if ((long *)CONCAT44(local_830._4_4_,local_830.decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_830._4_4_,local_830.decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_688.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_688.twine);
  }
  local_690.twine = local_680;
  local_688 = (Child)0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_690,local_580.cString,
             (char *)((long)&(local_580.twine)->LHS + ((ulong)local_578.twine & 0xffffffff)));
  llvm::Twine::Twine((Twine *)&local_830,"link_to_other_dir");
  pcVar3 = "";
  llvm::Twine::Twine((Twine *)&local_890,"");
  llvm::Twine::Twine((Twine *)local_848,"");
  llvm::Twine::Twine((Twine *)local_870,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_690,(Twine *)&local_830,(Twine *)&local_890,
             (Twine *)local_848,(Twine *)local_870);
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_360);
  pcVar5 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_690);
  local_854 = llbuild::basic::sys::symlink(pcVar4,pcVar5);
  local_890.decUI = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_830.character,"res","0",&local_854,&local_890.decI);
  if (local_830.character == '\0') {
    testing::Message::Message((Message *)&local_890);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_828.twine !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((_Alloc_hider *)&(local_828.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_848,(Message *)&local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_848);
    if ((long *)CONCAT44(local_890._4_4_,local_890.decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_890._4_4_,local_890.decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_828.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_828.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_828.twine);
  }
  llbuild::basic::createLocalFileSystem();
  CVar1 = local_848[0];
  pcVar3 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_580);
  std::__cxx11::string::string
            ((string *)&local_830.character,pcVar3,(allocator *)&local_890.character);
  cVar2 = (**(code **)(*CVar1.decUL + 0x28))(CVar1.twine,&local_830);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_830._4_4_,local_830.decUI) != local_820) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_830._4_4_,local_830.decUI),
                    local_820[0]._M_allocated_capacity + 1);
  }
  local_890.character = cVar2;
  local_888[0].twine = (Twine *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)local_870);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_830,(internal *)&local_890.character,(AssertionResult *)"result",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x92,(char *)CONCAT44(local_830._4_4_,local_830.decUI));
    testing::internal::AssertHelper::operator=(&local_878,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_830._4_4_,local_830.decUI) != local_820) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_830._4_4_,local_830.decUI),
                      local_820[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_888[0].character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_888[0].twine);
  }
  local_870[0].decUI = 0xffffffff;
  pcVar3 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_580);
  local_878.data_._0_4_ = llbuild::basic::sys::stat(pcVar3,(stat *)&local_830);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_890.character,"-1","sys::stat(tempDir.c_str(), &statbuf)",
             &local_870[0].decI,(int *)&local_878);
  if (local_890.character == '\0') {
    testing::Message::Message((Message *)local_870);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)&(local_888[0].stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_878,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_888[0].character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_888[0].twine);
  }
  local_870[0].decUI = 2;
  rhs = __errno_location();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_890.character,"2","(*__errno_location ())",&local_870[0].decI,rhs);
  if (local_890.character == '\0') {
    testing::Message::Message((Message *)local_870);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)&(local_888[0].stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_878,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_888[0].character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_888[0].twine);
  }
  local_870[0].decUI = 0;
  pcVar3 = llvm::SmallString<256U>::c_str(&local_250);
  local_878.data_._0_4_ = llbuild::basic::sys::stat(pcVar3,(stat *)&local_830);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_890.character,"0","sys::stat(file.c_str(), &statbuf)",
             &local_870[0].decI,(int *)&local_878);
  if (local_890.character == '\0') {
    testing::Message::Message((Message *)local_870);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)&(local_888[0].stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(&local_878,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_888[0].character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_888[0].twine);
  }
  local_870[0].decUI = 0;
  pcVar3 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_470);
  local_878.data_._0_4_ = llbuild::basic::sys::stat(pcVar3,(stat *)&local_830);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_890.character,"0","sys::stat(otherFile.c_str(), &statbuf)",
             &local_870[0].decI,(int *)&local_878);
  if (local_890.character == '\0') {
    testing::Message::Message((Message *)local_870);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)&(local_888[0].stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_878,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888[0].twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_888[0].character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_888[0].twine);
  }
  if (local_848[0].twine != (Twine *)0x0) {
    (**(code **)(*local_848[0].decUL + 8))();
  }
  if (local_690.twine != local_680) {
    free(local_690.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0.twine != local_790) {
    free(local_7a0.twine);
  }
  if (local_580.twine != local_570) {
    free(local_580.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.twine != local_460) {
    free(local_470.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine != local_350) {
    free(local_360.twine);
  }
  if ((SmallVectorStorage<char,_256U> *)
      local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX !=
      &local_250.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>) {
    free(local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  llbuild::TmpDir::~TmpDir(&local_140);
  return;
}

Assistant:

TEST(FileSystemTest, testRecursiveRemovalDoesNotFollowSymlinks) {
  TmpDir rootTempDir(__func__);

  SmallString<256> file{ rootTempDir.str() };
  llvm::sys::path::append(file, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(file.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> otherDir{ rootTempDir.str() };
  llvm::sys::path::append(otherDir, "other_dir");
  sys::mkdir(otherDir.c_str());

  SmallString<256> otherFile{ otherDir.str() };
  llvm::sys::path::append(otherFile, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(otherFile.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> tempDir { rootTempDir.str() };
  llvm::sys::path::append(tempDir, "root");
  sys::mkdir(tempDir.c_str());

  SmallString<256> linkPath { tempDir.str() };
  llvm::sys::path::append(linkPath, "link.txt");
  int res = sys::symlink(file.c_str(), linkPath.c_str());
  EXPECT_EQ(res, 0);

  SmallString<256> directoryLinkPath { tempDir.str() };
  llvm::sys::path::append(directoryLinkPath, "link_to_other_dir");
  res = sys::symlink(otherDir.c_str(), directoryLinkPath.c_str());
  EXPECT_EQ(res, 0);

  auto fs = createLocalFileSystem();
  bool result = fs->remove(tempDir.c_str());
  EXPECT_TRUE(result);

  sys::StatStruct  statbuf;
  EXPECT_EQ(-1, sys::stat(tempDir.c_str(), &statbuf));
  EXPECT_EQ(ENOENT, errno);
  // Verify that the symlink target still exists.
  EXPECT_EQ(0, sys::stat(file.c_str(), &statbuf));
  // Verify that we did not delete the symlinked directories contents.
  EXPECT_EQ(0, sys::stat(otherFile.c_str(), &statbuf));
}